

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

char * Wlc_ObjName(Wlc_Ntk_t *p,int iObj)

{
  uint uVar1;
  int NameId;
  char *pcVar2;
  
  uVar1 = (p->vNameIds).nSize;
  if (0 < (int)uVar1) {
    if (uVar1 <= (uint)iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    NameId = (p->vNameIds).pArray[(uint)iObj];
    if (NameId != 0) {
      pcVar2 = Abc_NamStr(p->pManName,NameId);
      return pcVar2;
    }
  }
  sprintf(Wlc_ObjName::Buffer,"n%d");
  return Wlc_ObjName::Buffer;
}

Assistant:

char * Wlc_ObjName( Wlc_Ntk_t * p, int iObj )
{
    static char Buffer[100];
    if ( Wlc_NtkHasNameId(p) && Wlc_ObjNameId(p, iObj) )
        return Abc_NamStr( p->pManName, Wlc_ObjNameId(p, iObj) );
    sprintf( Buffer, "n%d", iObj );
    return Buffer;
}